

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_PartiteGraph.cpp
# Opt level: O0

void __thiscall
PartiteGraphTest_test_get_partition_of_vertex_Test::TestBody
          (PartiteGraphTest_test_get_partition_of_vertex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4 [3];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180;
  int local_174 [3];
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  int local_144 [3];
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  int local_120;
  allocator local_119;
  FirstPartitionType<0U> local_118;
  int local_f8 [5];
  allocator local_e1;
  FirstPartitionType<0U> local_e0;
  int local_bc;
  undefined1 local_b8 [8];
  PartiteGraph<int,_Vertex,_Edge> graph;
  PartiteGraphTest_test_get_partition_of_vertex_Test *this_local;
  
  graph._partition._M_h._M_single_bucket = (__node_base_ptr)this;
  ::graph::PartiteGraph<int,_Vertex,_Edge>::PartiteGraph
            ((PartiteGraph<int,_Vertex,_Edge> *)local_b8);
  local_bc = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"0",&local_e1);
  ::graph::PartiteGraph<int,Vertex,Edge>::add_vertex<0u>
            ((PartiteGraph<int,Vertex,Edge> *)local_b8,&local_bc,&local_e0);
  Vertex::~Vertex(&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_f8[0] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"1",&local_119);
  ::graph::PartiteGraph<int,Vertex,Edge>::add_vertex<0u>
            ((PartiteGraph<int,Vertex,Edge> *)local_b8,local_f8,&local_118);
  Vertex::~Vertex(&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_120 = 2;
  gtest_ar.message_.ptr_._4_4_ = 0x3f800000;
  ::graph::PartiteGraph<int,Vertex,Edge>::add_vertex<1u>
            ((PartiteGraph<int,Vertex,Edge> *)local_b8,&local_120,
             (PartitionType<1U> *)((long)&gtest_ar.message_.ptr_ + 4));
  local_144[1] = 0;
  local_144[2] = ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition
                           ((PartiteGraph<int,_Vertex,_Edge> *)local_b8,local_144 + 1,0);
  local_144[0] = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_138,"graph.get_vertex_partition(0)","0",
             (uint *)(local_144 + 2),local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_174[1] = 1;
  local_174[2] = ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition
                           ((PartiteGraph<int,_Vertex,_Edge> *)local_b8,local_174 + 1,0);
  local_174[0] = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_168,"graph.get_vertex_partition(1)","0",
             (uint *)(local_174 + 2),local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1a4[1] = 2;
  local_1a4[2] = ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition
                           ((PartiteGraph<int,_Vertex,_Edge> *)local_b8,local_1a4 + 1,0);
  local_1a4[0] = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_198,"graph.get_vertex_partition(2)","1",
             (uint *)(local_1a4 + 2),local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  ::graph::PartiteGraph<int,_Vertex,_Edge>::~PartiteGraph
            ((PartiteGraph<int,_Vertex,_Edge> *)local_b8);
  return;
}

Assistant:

TEST(PartiteGraphTest, test_get_partition_of_vertex) {
    graph::PartiteGraph<int, Vertex, Edge> graph;
    graph.add_vertex<vertex_partition>(0, {"0"});
    graph.add_vertex<vertex_partition>(1, {"1"});
    graph.add_vertex<edge_partition>(2, {1.0});

    EXPECT_EQ(graph.get_vertex_partition(0), 0);
    EXPECT_EQ(graph.get_vertex_partition(1), 0);
    EXPECT_EQ(graph.get_vertex_partition(2), 1);
}